

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O0

Group * __thiscall VArenaAlloc::make<rlottie::internal::model::Group>(VArenaAlloc *this)

{
  uint32_t uVar1;
  uint32_t padding_00;
  Group *pGVar2;
  FooterAction *action;
  VArenaAlloc *in_RDI;
  FooterAction *releaser;
  uint32_t padding;
  char *objStart;
  uint32_t alignment;
  uint32_t size;
  _lambda_char___1_ local_29;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = ToU32(0x30);
  ToU32(8);
  pGVar2 = (Group *)allocObjectWithFooter
                              ((VArenaAlloc *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                               (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                               (uint32_t)in_stack_ffffffffffffffd8);
  padding_00 = ToU32((long)pGVar2 - (long)in_RDI->fCursor);
  in_RDI->fCursor = (char *)((long)&(pGVar2->super_Object).field_0 + (ulong)uVar1);
  action = make()::{lambda(char*)#1}::operator_cast_to_function_pointer(&local_29);
  installFooter(in_RDI,action,padding_00);
  rlottie::internal::model::Group::Group((Group *)in_RDI);
  return pGVar2;
}

Assistant:

T* make(Args&&... args) {
        uint32_t size      = ToU32(sizeof(T));
        uint32_t alignment = ToU32(alignof(T));
        char* objStart;
        if (std::is_trivially_destructible<T>::value) {
            objStart = this->allocObject(size, alignment);
            fCursor = objStart + size;
        } else {
            objStart = this->allocObjectWithFooter(size + sizeof(Footer), alignment);
            // Can never be UB because max value is alignof(T).
            uint32_t padding = ToU32(objStart - fCursor);

            // Advance to end of object to install footer.
            fCursor = objStart + size;
            FooterAction* releaser = [](char* objEnd) {
                char* objStart = objEnd - (sizeof(T) + sizeof(Footer));
                ((T*)objStart)->~T();
                return objStart;
            };
            this->installFooter(releaser, padding);
        }

        // This must be last to make objects with nested use of this allocator work.
        return new(objStart) T(std::forward<Args>(args)...);
    }